

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hh
# Opt level: O0

void __thiscall xt::_Node::_Node(_Node *this)

{
  shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>_> local_20;
  _Node *local_10;
  _Node *this_local;
  
  local_10 = this;
  std::shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>_>::shared_ptr(&this->array);
  new_object_array((xt *)&local_20,0x20);
  std::shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>_>::operator=
            (&this->array,&local_20);
  std::shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>_>::~shared_ptr(&local_20);
  return;
}

Assistant:

_Node() { array = new_object_array(32); }